

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O3

void __thiscall SQTable::~SQTable(SQTable *this)

{
  _HashNode *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQTable_00140c28;
  SQDelegable::SetDelegate(&this->super_SQDelegable,(SQTable *)0x0);
  if (((this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
  }
  lVar2 = this->_numofnodes;
  if (0 < lVar2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      p_Var1 = this->_nodes;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&(p_Var1->key).super_SQObject._type + lVar4));
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&(p_Var1->val).super_SQObject._type + lVar4));
      lVar3 = lVar3 + 1;
      lVar2 = this->_numofnodes;
      lVar4 = lVar4 + 0x28;
    } while (lVar3 < lVar2);
  }
  sq_vm_free(this->_nodes,lVar2 * 0x28);
  SQRefCounted::~SQRefCounted((SQRefCounted *)this);
  return;
}

Assistant:

~SQTable()
    {
        SetDelegate(NULL);
        REMOVE_FROM_CHAIN(&_sharedstate->_gc_chain, this);
        for (SQInteger i = 0; i < _numofnodes; i++) _nodes[i].~_HashNode();
        SQ_FREE(_nodes, _numofnodes * sizeof(_HashNode));
    }